

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

bool __thiscall cfd::Psbt::IsFindTxIn(Psbt *this,OutPoint *outpoint,uint32_t *index)

{
  uint32_t uVar1;
  string errmsg;
  undefined **local_40;
  void *local_38;
  
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->field_0x10,(uint)&local_40);
  local_40 = &PTR__Txid_002b0f00;
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  if (index != (uint32_t *)0x0) {
    *index = uVar1;
  }
  return true;
}

Assistant:

bool Psbt::IsFindTxIn(const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index =
        base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}